

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

string * __thiscall
glcts::GeometryShaderMoreACsInGSThanSupportedTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMoreACsInGSThanSupportedTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar2;
  GLint gl_max_ACs_value;
  string *gs_code_specialized;
  string gs_code;
  char *gs_code_raw;
  stringstream code_sstream;
  long *local_1e0;
  long local_1d0 [2];
  char *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x671);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\n"
             ,0x75);
  iVar1 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding = 0) uniform atomic_uint counter",0x2f);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
    iVar1 = iVar1 + 1;
  } while (iVar1 < 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nvoid main()\n{\n",0xf);
  iVar1 = 0;
  while (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    if ((gl_PrimitiveIDIn % ",0x1c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1 + 1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,") == 0) atomicCounterIncrement(counter",0x26);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,");\n",3);
    iVar1 = iVar1 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n",0x41);
  std::__cxx11::stringbuf::str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_1c0);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMoreACsInGSThanSupportedTest::getGSCode()
{
	std::stringstream	 code_sstream;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_ACs_value = 0;

	/* Retrieve GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &gl_max_ACs_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname");

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n";

	for (glw::GLint n_ac = 0; n_ac < (gl_max_ACs_value + 1); ++n_ac)
	{
		code_sstream << "layout(binding = 0) uniform atomic_uint counter" << n_ac << ";\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_ac = 0; n_ac < (gl_max_ACs_value + 1); ++n_ac)
	{
		code_sstream << "    if ((gl_PrimitiveIDIn % " << (n_ac + 1) << ") == 0) atomicCounterIncrement(counter" << n_ac
					 << ");\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1, /* parts */
													   &gs_code_raw);

	return gs_code_specialized;
}